

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

double hcephes_cosm1(double x)

{
  double dVar1;
  double dVar2;
  
  if (0.7853981633974483 < ABS(x)) {
    dVar1 = cos(x);
    return dVar1 + -1.0;
  }
  dVar1 = x * x;
  dVar2 = hcephes_polevl(dVar1,coscof,6);
  return dVar2 * dVar1 * dVar1 + dVar1 * -0.5;
}

Assistant:

HCEPHES_API double hcephes_cosm1(double x) {
    double xx;

    if ((x < -HCEPHES_PIO4) || (x > HCEPHES_PIO4))
        return (cos(x) - 1.0);
    xx = x * x;
    xx = -0.5 * xx + xx * xx * hcephes_polevl(xx, coscof, 6);
    return xx;
}